

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall PClassActor::SetPainChance(PClassActor *this,FName *type,int chance)

{
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this_00;
  FName local_2c;
  int local_28;
  FName local_24;
  
  this_00 = this->PainChances;
  if (chance < 0) {
    if (this_00 != (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)0x0) {
      local_2c = (FName)type->Index;
      TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Remove(this_00,&local_2c);
    }
  }
  else {
    if (this_00 == (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)0x0) {
      this_00 = (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)operator_new(0x18);
      TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap(this_00);
      this->PainChances = this_00;
    }
    local_24 = (FName)type->Index;
    local_28 = 0x100;
    if ((uint)chance < 0x100) {
      local_28 = chance;
    }
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Insert(this_00,&local_24,&local_28);
  }
  return;
}

Assistant:

void PClassActor::SetPainChance(FName type, int chance)
{
	if (chance >= 0) 
	{
		if (PainChances == NULL)
		{
			PainChances = new PainChanceList;
		}
		PainChances->Insert(type, MIN(chance, 256));
	}
	else if (PainChances != NULL)
	{
		PainChances->Remove(type);
	}
}